

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

void __thiscall
CVmObjVector::restore_from_file(CVmObjVector *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  CVmVarHeap *pCVar2;
  char *buf;
  CVmObjFixup *in_RCX;
  CVmObjVector *in_RDX;
  long in_RDI;
  size_t alloc_cnt;
  size_t ele_cnt;
  size_t in_stack_ffffffffffffffa8;
  CVmFile *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  CVmFile *in_stack_ffffffffffffffc0;
  
  CVmFile::read_uint2(in_stack_ffffffffffffffb0);
  uVar1 = CVmFile::read_uint2(in_stack_ffffffffffffffb0);
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,*(undefined8 *)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  alloc_vector((CVmObjVector *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  set_element_count((CVmObjVector *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  buf = get_element_ptr(in_RDX,in_stack_ffffffffffffffa8);
  calc_alloc_ele((ulong)uVar1);
  CVmFile::read_bytes(in_stack_ffffffffffffffc0,buf,(size_t)in_RDX);
  get_element_ptr(in_RDX,in_stack_ffffffffffffffa8);
  CVmObjFixup::fix_dh_array(in_RCX,buf,(size_t)in_RDX);
  return;
}

Assistant:

void CVmObjVector::restore_from_file(VMG_ vm_obj_id_t self,
                                     CVmFile *fp, CVmObjFixup *fixups)
{
    size_t ele_cnt;
    size_t alloc_cnt;

    /* read the element count and the full allocation count */
    alloc_cnt = fp->read_uint2();
    ele_cnt = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate the space at the allocation count */
    alloc_vector(vmg_ alloc_cnt);

    /* set the actual in-use element count */
    set_element_count(ele_cnt);

    /* read the contents */
    fp->read_bytes(get_element_ptr(0), calc_alloc_ele(ele_cnt));

    /* fix up object references in the values */
    fixups->fix_dh_array(vmg_ get_element_ptr(0), ele_cnt);
}